

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test26(char *infile,char *password,char *outfile,char *xarg)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 uStack_30;
  qpdf_oh trailer;
  qpdf_data qpdf2;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf2 = (qpdf_data)xarg;
  xarg_local = outfile;
  outfile_local = password;
  password_local = infile;
  uStack_30 = qpdf_init();
  uVar1 = qpdf_get_trailer(uStack_30);
  iVar2 = qpdf_oh_is_initialized(uStack_30,uVar1);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_oh_is_initialized(qpdf2, trailer)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x324,"void test26(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_oh_get_type_code(qpdf,uVar1);
  if (iVar2 == 0) {
    qpdf_cleanup(&stack0xffffffffffffffd0);
    return;
  }
  __assert_fail("qpdf_oh_get_type_code(qpdf, trailer) == ot_uninitialized",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x325,"void test26(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test26(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Make sure we detect uninitialized objects */
    qpdf_data qpdf2 = qpdf_init();
    qpdf_oh trailer = qpdf_get_trailer(qpdf2);
    assert(!qpdf_oh_is_initialized(qpdf2, trailer));
    assert(qpdf_oh_get_type_code(qpdf, trailer) == ot_uninitialized);
    qpdf_cleanup(&qpdf2);
}